

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helpers.cc
# Opt level: O0

string * __thiscall
google::protobuf::compiler::python::GetFileName_abi_cxx11_
          (string *__return_storage_ptr__,python *this,FileDescriptor *file_des,string_view suffix)

{
  string_view pc;
  DescriptorStringView this_00;
  char *pcVar1;
  string_view filename_00;
  AlphaNum local_d0;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  local_a0;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  *local_80;
  undefined8 local_78;
  undefined1 local_59;
  undefined1 local_58 [16];
  undefined1 local_48 [8];
  string module_name;
  FileDescriptor *file_des_local;
  string_view suffix_local;
  string *filename;
  
  pcVar1 = (char *)suffix._M_len;
  module_name.field_2._8_8_ = this;
  this_00 = FileDescriptor::name_abi_cxx11_((FileDescriptor *)this);
  local_58 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)this_00);
  filename_00._M_len = local_58._8_8_;
  filename_00._M_str = pcVar1;
  ModuleName_abi_cxx11_((string *)local_48,local_58._0_8_,filename_00);
  local_59 = 0;
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)local_48);
  std::
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  ::pair<const_char_(&)[2],_const_char_(&)[2],_true>
            (&local_a0,(char (*) [2])0x6da370,(char (*) [2])0x621f1f);
  local_80 = &local_a0;
  local_78 = 1;
  absl::lts_20240722::StrReplaceAll(local_80,1,__return_storage_ptr__);
  pc._M_str = (char *)suffix._M_len;
  pc._M_len = (size_t)file_des;
  absl::lts_20240722::AlphaNum::AlphaNum(&local_d0,pc);
  absl::lts_20240722::StrAppend((string *)__return_storage_ptr__,&local_d0);
  local_59 = 1;
  std::__cxx11::string::~string((string *)local_48);
  return __return_storage_ptr__;
}

Assistant:

std::string GetFileName(const FileDescriptor* file_des,
                        absl::string_view suffix) {
  std::string module_name = ModuleName(file_des->name());
  std::string filename = module_name;
  absl::StrReplaceAll({{".", "/"}}, &filename);
  absl::StrAppend(&filename, suffix);
  return filename;
}